

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light_epoch.h
# Opt level: O1

void __thiscall FASTER::core::LightEpoch::Drain(LightEpoch *this,uint64_t nextEpoch)

{
  atomic<unsigned_int> *paVar1;
  ulong uVar2;
  _func_void_IAsyncContext_ptr *p_Var3;
  IAsyncContext *pIVar4;
  ulong uVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  EpochAction *pEVar9;
  bool bVar10;
  
  if (this->num_entries_ != 0) {
    uVar6 = this->num_entries_ + 1;
    uVar5 = 2;
    if (2 < uVar6) {
      uVar5 = (ulong)uVar6;
    }
    lVar7 = 0x40;
    do {
      uVar2 = *(ulong *)((long)&this->table_->local_current_epoch + lVar7);
      uVar8 = nextEpoch;
      if (uVar2 < nextEpoch) {
        uVar8 = uVar2;
      }
      if (uVar2 != 0) {
        nextEpoch = uVar8;
      }
      lVar7 = lVar7 + 0x40;
    } while (uVar5 * 0x40 != lVar7);
  }
  LOCK();
  (this->safe_to_reclaim_epoch).super___atomic_base<unsigned_long>._M_i = nextEpoch - 1;
  UNLOCK();
  pEVar9 = this->drain_list_;
  paVar1 = &this->drain_count_;
  uVar6 = 0;
  while( true ) {
    uVar5 = (pEVar9->epoch).super___atomic_base<unsigned_long>._M_i;
    if (uVar5 <= (this->safe_to_reclaim_epoch).super___atomic_base<unsigned_long>._M_i) {
      LOCK();
      bVar10 = uVar5 == (pEVar9->epoch).super___atomic_base<unsigned_long>._M_i;
      if (bVar10) {
        (pEVar9->epoch).super___atomic_base<unsigned_long>._M_i = 0xfffffffffffffffe;
      }
      UNLOCK();
      if (bVar10) {
        p_Var3 = pEVar9->callback;
        pIVar4 = pEVar9->context;
        pEVar9->callback = (_func_void_IAsyncContext_ptr *)0x0;
        pEVar9->context = (IAsyncContext *)0x0;
        LOCK();
        (pEVar9->epoch).super___atomic_base<unsigned_long>._M_i = 0xffffffffffffffff;
        UNLOCK();
        (*p_Var3)(pIVar4);
        LOCK();
        (paVar1->super___atomic_base<unsigned_int>)._M_i =
             (paVar1->super___atomic_base<unsigned_int>)._M_i - 1;
        UNLOCK();
        if ((paVar1->super___atomic_base<unsigned_int>)._M_i == 0) {
          return;
        }
      }
    }
    if (0xfe < uVar6) break;
    uVar6 = uVar6 + 1;
    pEVar9 = pEVar9 + 1;
  }
  return;
}

Assistant:

void Drain(uint64_t nextEpoch) {
    ComputeNewSafeToReclaimEpoch(nextEpoch);
    for(uint32_t idx = 0; idx < kDrainListSize; ++idx) {
      uint64_t trigger_epoch = drain_list_[idx].epoch.load();
      if(trigger_epoch <= safe_to_reclaim_epoch) {
        if(drain_list_[idx].TryPop(trigger_epoch)) {
          if(--drain_count_ == 0) {
            break;
          }
        }
      }
    }
  }